

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O0

int nn_sock_recv(nn_sock *self,nn_msg *msg,int flags)

{
  FILE *__stream;
  int iVar1;
  uint errnum;
  char *pcVar2;
  uint64_t uVar3;
  int local_50;
  int local_3c;
  int timeout;
  uint64_t now;
  uint64_t deadline;
  int rc;
  int flags_local;
  nn_msg *msg_local;
  nn_sock *self_local;
  
  if ((self->socktype->flags & 1U) != 0) {
    return -0x5f;
  }
  nn_ctx_enter(&self->ctx);
  if (self->rcvtimeo < 0) {
    now = 0xffffffffffffffff;
    local_3c = -1;
  }
  else {
    uVar3 = nn_clock_ms();
    now = uVar3 + (long)self->rcvtimeo;
    local_3c = self->rcvtimeo;
  }
  while( true ) {
    iVar1 = self->state;
    if (1 < iVar1 - 1U) {
      if (iVar1 == 3) {
        nn_ctx_leave(&self->ctx);
        return -0x9523dfd;
      }
      if (iVar1 - 4U < 3) {
        nn_ctx_leave(&self->ctx);
        return -9;
      }
    }
    iVar1 = (*self->sockbase->vfptr->recv)(self->sockbase,msg);
    if (iVar1 == 0) {
      nn_ctx_leave(&self->ctx);
      return 0;
    }
    if (-1 < iVar1) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/sock.c"
              ,0x2dc);
      fflush(_stderr);
      nn_err_abort();
    }
    if (iVar1 != -0xb) {
      nn_ctx_leave(&self->ctx);
      return iVar1;
    }
    if ((flags & 1U) != 0) {
      nn_ctx_leave(&self->ctx);
      return -0xb;
    }
    nn_ctx_leave(&self->ctx);
    errnum = nn_efd_wait(&self->rcvfd,local_3c);
    __stream = _stderr;
    if (errnum == 0xffffff92) {
      return -0x6e;
    }
    if (errnum == 0xfffffffc) break;
    if (errnum == 0xfffffff7) {
      return -9;
    }
    if (errnum != 0) {
      pcVar2 = nn_err_strerror(errnum);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)errnum,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/sock.c"
              ,0x2f5);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_ctx_enter(&self->ctx);
    iVar1 = nn_efd_wait(&self->rcvfd,0);
    if (iVar1 == 0) {
      self->flags = self->flags | 1;
    }
    if (-1 < self->rcvtimeo) {
      uVar3 = nn_clock_ms();
      if (now < uVar3) {
        local_50 = 0;
      }
      else {
        local_50 = (int)now - (int)uVar3;
      }
      local_3c = local_50;
    }
  }
  return -4;
}

Assistant:

int nn_sock_recv (struct nn_sock *self, struct nn_msg *msg, int flags)
{
    int rc;
    uint64_t deadline;
    uint64_t now;
    int timeout;

    /*  Some sockets types cannot be used for receiving messages. */
    if (nn_slow (self->socktype->flags & NN_SOCKTYPE_FLAG_NORECV))
        return -ENOTSUP;

    nn_ctx_enter (&self->ctx);

    /*  Compute the deadline for RCVTIMEO timer. */
    if (self->rcvtimeo < 0) {
        deadline = -1;
        timeout = -1;
    }
    else {
        deadline = nn_clock_ms() + self->rcvtimeo;
        timeout = self->rcvtimeo;
    }

    while (1) {

        switch (self->state) {
        case NN_SOCK_STATE_ACTIVE:
        case NN_SOCK_STATE_INIT:
             break;

        case NN_SOCK_STATE_ZOMBIE:
            /*  If nn_term() was already called, return ETERM. */
            nn_ctx_leave (&self->ctx);
            return -ETERM;

        case NN_SOCK_STATE_STOPPING_EPS:
        case NN_SOCK_STATE_STOPPING:
        case NN_SOCK_STATE_FINI:
            /*  Socket closed or closing.  Should we return something
                else here; recvmsg(2) for example returns no data in
                this case, like read(2).  The use of indexed file
                descriptors is further problematic, as an FD can be reused
                leading to situations where technically the outstanding
                operation should refer to some other socket entirely.  */
            nn_ctx_leave (&self->ctx);
            return -EBADF;
        }

        /*  Try to receive the message in a non-blocking way. */
        rc = self->sockbase->vfptr->recv (self->sockbase, msg);
        if (nn_fast (rc == 0)) {
            nn_ctx_leave (&self->ctx);
            return 0;
        }
        nn_assert (rc < 0);

        /*  Any unexpected error is forwarded to the caller. */
        if (nn_slow (rc != -EAGAIN)) {
            nn_ctx_leave (&self->ctx);
            return rc;
        }

        /*  If the message cannot be received at the moment and the recv call
            is non-blocking, return immediately. */
        if (nn_fast (flags & NN_DONTWAIT)) {
            nn_ctx_leave (&self->ctx);
            return -EAGAIN;
        }

        /*  With blocking recv, wait while there are new pipes available
            for receiving. */
        nn_ctx_leave (&self->ctx);
        rc = nn_efd_wait (&self->rcvfd, timeout);
        if (nn_slow (rc == -ETIMEDOUT))
            return -ETIMEDOUT;
        if (nn_slow (rc == -EINTR))
            return -EINTR;
        if (nn_slow (rc == -EBADF))
            return -EBADF;
        errnum_assert (rc == 0, rc);
        nn_ctx_enter (&self->ctx);
        /*
         *  Double check if pipes are still available for receiving
         */
        if (!nn_efd_wait (&self->rcvfd, 0)) {
            self->flags |= NN_SOCK_FLAG_IN;
        }

        /*  If needed, re-compute the timeout to reflect the time that have
            already elapsed. */
        if (self->rcvtimeo >= 0) {
            now = nn_clock_ms();
            timeout = (int) (now > deadline ? 0 : deadline - now);
        }
    }
}